

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O2

int luaU_dump(lua_State *L,Proto *f,lua_Writer w,void *data,int strip)

{
  StkId pSVar1;
  Table *x_;
  int i;
  undefined4 uStack_6c;
  DumpState local_68;
  
  local_68.h = luaH_new(L);
  pSVar1 = (L->top).p;
  (pSVar1->val).value_.gc = (GCObject *)local_68.h;
  (pSVar1->val).tt_ = 'E';
  (L->top).p = (StkId)((L->top).offset + 0x10);
  local_68.nstr = 0;
  local_68.L = L;
  local_68.writer = w;
  local_68.data = data;
  local_68.strip = strip;
  local_68.status = (*w)(L,"\x1bLua",4,data);
  local_68.offset = 4;
  dumpByte(&local_68,0x55);
  dumpByte(&local_68,0);
  if (local_68.status == 0) {
    local_68.status = (*local_68.writer)(local_68.L,anon_var_dwarf_de23,6,local_68.data);
    local_68.offset = local_68.offset + 6;
  }
  _i = CONCAT44(uStack_6c,0xffffa988);
  dumpByte(&local_68,4);
  if (local_68.status == 0) {
    local_68.status = (*local_68.writer)(local_68.L,&i,4,local_68.data);
    local_68.offset = local_68.offset + 4;
  }
  _i = CONCAT44(uStack_6c,0x12345678);
  dumpByte(&local_68,4);
  if (local_68.status == 0) {
    local_68.status = (*local_68.writer)(local_68.L,&i,4,local_68.data);
    local_68.offset = local_68.offset + 4;
  }
  _i = 0xffffffffffffa988;
  dumpByte(&local_68,8);
  if (local_68.status == 0) {
    local_68.status = (*local_68.writer)(local_68.L,&i,8,local_68.data);
    local_68.offset = local_68.offset + 8;
  }
  _i = 0xc077280000000000;
  dumpByte(&local_68,8);
  if (local_68.status == 0) {
    local_68.status = (*local_68.writer)(local_68.L,&i,8,local_68.data);
    local_68.offset = local_68.offset + 8;
  }
  dumpByte(&local_68,f->sizeupvalues);
  dumpFunction(&local_68,f);
  if (local_68.status == 0) {
    local_68.status = (*local_68.writer)(local_68.L,(void *)0x0,0,local_68.data);
  }
  return local_68.status;
}

Assistant:

int luaU_dump (lua_State *L, const Proto *f, lua_Writer w, void *data,
               int strip) {
  DumpState D;
  D.h = luaH_new(L);  /* aux. table to keep strings already dumped */
  sethvalue2s(L, L->top.p, D.h);  /* anchor it */
  L->top.p++;
  D.L = L;
  D.writer = w;
  D.offset = 0;
  D.data = data;
  D.strip = strip;
  D.status = 0;
  D.nstr = 0;
  dumpHeader(&D);
  dumpByte(&D, f->sizeupvalues);
  dumpFunction(&D, f);
  dumpBlock(&D, NULL, 0);  /* signal end of dump */
  return D.status;
}